

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * __thiscall efsw::String::replace(String *this,Iterator i1,Iterator i2,String *str)

{
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  replace(&this->mString,(long)i1._M_current - (long)(this->mString)._M_dataplus._M_p >> 2,
          (long)i2._M_current - (long)i1._M_current >> 2,(str->mString)._M_dataplus._M_p,
          (str->mString)._M_string_length);
  return this;
}

Assistant:

String& String::replace( Iterator i1, Iterator i2, const String& str ) {
	mString.replace( i1, i2, str.mString );

	return *this;
}